

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O0

CURLcode smtp_perform_upgrade_tls(connectdata *conn)

{
  smtp_conn *smtpc;
  CURLcode result;
  connectdata *conn_local;
  
  smtpc._4_4_ = Curl_ssl_connect_nonblocking(conn,0,&(conn->proto).imapc.ssldone);
  if (smtpc._4_4_ == CURLE_OK) {
    if ((conn->proto).imapc.state != IMAP_AUTHENTICATE) {
      state(conn,SMTP_UPGRADETLS);
    }
    if (((conn->proto).imapc.ssldone & 1U) != 0) {
      smtp_to_smtps(conn);
      smtpc._4_4_ = smtp_perform_ehlo(conn);
    }
  }
  return smtpc._4_4_;
}

Assistant:

static CURLcode smtp_perform_upgrade_tls(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct smtp_conn *smtpc = &conn->proto.smtpc;

  /* Start the SSL connection */
  result = Curl_ssl_connect_nonblocking(conn, FIRSTSOCKET, &smtpc->ssldone);

  if(!result) {
    if(smtpc->state != SMTP_UPGRADETLS)
      state(conn, SMTP_UPGRADETLS);

    if(smtpc->ssldone) {
      smtp_to_smtps(conn);
      result = smtp_perform_ehlo(conn);
    }
  }

  return result;
}